

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O3

REF_STATUS ref_search_distance2(REF_DBL *xyz0,REF_DBL *xyz1,REF_DBL *xyz,REF_DBL *distance)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  dVar2 = *xyz0;
  dVar3 = xyz0[1];
  dVar6 = *xyz1 - dVar2;
  dVar4 = xyz1[1] - dVar3;
  dVar1 = xyz0[2];
  dVar5 = xyz1[2] - dVar1;
  dVar7 = *xyz - dVar2;
  dVar9 = xyz[1] - dVar3;
  dVar8 = xyz[2] - dVar1;
  dVar11 = dVar5 * dVar5 + dVar6 * dVar6 + dVar4 * dVar4;
  dVar10 = dVar8 * dVar5 + dVar7 * dVar6 + dVar4 * dVar9;
  auVar12._0_8_ = dVar11 * 1e+20;
  auVar12._8_8_ = dVar10;
  auVar13._8_8_ = -dVar10;
  auVar13._0_8_ = -auVar12._0_8_;
  auVar13 = maxpd(auVar12,auVar13);
  if (auVar13._0_8_ <= auVar13._8_8_) {
    dVar2 = dVar8 * dVar8 + dVar7 * dVar7 + dVar9 * dVar9;
  }
  else {
    dVar10 = dVar10 / dVar11;
    if (dVar10 <= 0.0) {
      dVar10 = 0.0;
    }
    if (1.0 <= dVar10) {
      dVar10 = 1.0;
    }
    dVar2 = *xyz - (dVar6 * dVar10 + dVar2);
    dVar4 = xyz[1] - (dVar4 * dVar10 + dVar3);
    dVar3 = xyz[2] - (dVar10 * dVar5 + dVar1);
    dVar2 = dVar3 * dVar3 + dVar2 * dVar2 + dVar4 * dVar4;
  }
  *distance = SQRT(dVar2);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_search_distance2(REF_DBL *xyz0, REF_DBL *xyz1,
                                        REF_DBL *xyz, REF_DBL *distance) {
  REF_DBL dl[3], dxyz[3], len2, proj2, t;
  dl[0] = xyz1[0] - xyz0[0];
  dl[1] = xyz1[1] - xyz0[1];
  dl[2] = xyz1[2] - xyz0[2];
  dxyz[0] = xyz[0] - xyz0[0];
  dxyz[1] = xyz[1] - xyz0[1];
  dxyz[2] = xyz[2] - xyz0[2];
  len2 = ref_math_dot(dl, dl);
  proj2 = ref_math_dot(dxyz, dl);
  if (ref_math_divisible(proj2, len2)) {
    t = proj2 / len2;
    t = MAX(t, 0.0);
    t = MIN(t, 1.0);
    dxyz[0] = xyz[0] - (xyz0[0] + t * dl[0]);
    dxyz[1] = xyz[1] - (xyz0[1] + t * dl[1]);
    dxyz[2] = xyz[2] - (xyz0[2] + t * dl[2]);
    *distance = sqrt(ref_math_dot(dxyz, dxyz));
  } else { /* length zero, either endpoint */
    *distance = sqrt(ref_math_dot(dxyz, dxyz));
  }

  return REF_SUCCESS;
}